

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O2

void __thiscall QAccessibleButton::actionNames(QAccessibleButton *this)

{
  long in_RSI;
  
  actionNames((QStringList *)this,(QAccessibleButton *)(in_RSI + -0x10));
  return;
}

Assistant:

QStringList QAccessibleButton::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
        switch (role()) {
        case QAccessible::ButtonMenu:
            names << showMenuAction();
            break;
        case QAccessible::RadioButton:
            names << toggleAction();
            break;
        default:
            if (button()->isCheckable())
                names <<  toggleAction();
            names << pressAction();
            break;
        }
    }
    names << QAccessibleWidget::actionNames();
    return names;
}